

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall
BackwardPass::ProcessBailOnNoProfile(BackwardPass *this,Instr *instr,BasicBlock *block)

{
  OpCode OVar1;
  Opnd *this_00;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  BasicBlock *pBVar3;
  Instr *pIVar4;
  BasicBlock *pBVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  ushort uVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  Type *ppFVar12;
  long lVar13;
  Instr *instr_00;
  uint uVar14;
  Func **ppFVar15;
  TempObjectTracker *this_01;
  Instr **ppIVar16;
  IRKind IVar17;
  undefined1 local_70 [8];
  Iterator __iter;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *local_58;
  Instr *local_48;
  Instr *local_40;
  
  if (this->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar7) goto LAB_003e4967;
    *puVar10 = 0;
  }
  if (instr->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar7) goto LAB_003e4967;
    *puVar10 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar7) goto LAB_003e4967;
    *puVar10 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar7) goto LAB_003e4967;
    *puVar10 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if ((this->currentRegion != (Region *)0x0) &&
     ((byte)(this->currentRegion->type - RegionTypeCatch) < 2)) {
    return false;
  }
  local_40 = instr->m_prev;
  IVar17 = local_40->m_kind;
  if (((IVar17 == InstrKindProfiledLabel) || (IVar17 == InstrKindLabel)) &&
     (((ulong)local_40[1].m_func & 2) != 0)) {
    if (this->tag != BackwardPhase) {
      return false;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(this);
    if (!bVar7) {
      return false;
    }
    this_01 = block->tempObjectTracker;
  }
  else {
    ppIVar16 = &instr->m_prev;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_48 = (Instr *)0x0;
    while( true ) {
      if ((IVar17 < InstrKindExit) && ((0x68U >> (IVar17 & 0x1f) & 1) != 0)) goto LAB_003e4476;
      bVar7 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction(local_40);
      if ((bVar7) && (bVar7 = local_48 != (Instr *)0x0, local_48 = local_40, bVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20ab,"(insertionPointForGenerator == nullptr)",
                           "insertionPointForGenerator == nullptr");
        if (!bVar7) goto LAB_003e4967;
        *puVar10 = 0;
      }
      uVar14 = local_40->m_opcode - 0x248;
      if ((uVar14 < 7) && ((0x67U >> (uVar14 & 0x1f) & 1) != 0)) break;
      bVar7 = OpCodeAttr::CallInstr(local_40->m_opcode);
      pIVar11 = local_40->m_prev;
      if ((bVar7) && (pIVar11->m_opcode != BailOnNoProfile)) break;
      IVar17 = pIVar11->m_kind;
      local_40 = pIVar11;
    }
    IVar17 = local_40->m_kind;
LAB_003e4476:
    if ((IVar17 != InstrKindLabel) && (IVar17 != InstrKindProfiledLabel)) {
LAB_003e490d:
      BasicBlock::RemoveInstr(block,instr);
      return true;
    }
    pIVar11 = IR::Instr::GetNextRealInstrOrLabel(local_40);
    if ((pIVar11->m_opcode == Ld_A) &&
       (OVar8 = IR::Opnd::GetKind(pIVar11->m_dst), OVar8 == OpndKindReg)) {
      this_00 = pIVar11->m_dst;
      OVar8 = IR::Opnd::GetKind(this_00);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) {
LAB_003e4967:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar10 = 0;
      }
      if (((ushort)this_00[1].m_valueType.field_0 & 8) != 0) goto LAB_003e490d;
    }
    while( true ) {
      pIVar11 = *ppIVar16;
      if ((pIVar11->m_kind < 7) && ((0x68U >> (pIVar11->m_kind & 0x1f) & 1) != 0)) break;
      if (pIVar11->m_opcode == BailOnNoProfile) {
        if ((pIVar11->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x20e4,"(!curInstr->HasBailOutInfo())","!curInstr->HasBailOutInfo()");
          if (!bVar7) goto LAB_003e4967;
          *puVar10 = 0;
        }
        pIVar11 = pIVar11->m_next;
        IR::Instr::Remove(pIVar11->m_prev);
      }
      ppIVar16 = &pIVar11->m_prev;
    }
    IR::Instr::Unlink(instr);
    local_70 = (undefined1  [8])&block->predList;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_70;
LAB_003e45ed:
    do {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_003e4967;
        *puVar10 = 0;
      }
      pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])pSVar2 == local_70) goto LAB_003e48c4;
      __iter.list = pSVar2;
      ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_70);
      pBVar3 = (*ppFVar12)->predBlock;
      if (pBVar3 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20f3,"(pred)","pred");
        if (!bVar7) goto LAB_003e4967;
        *puVar10 = 0;
      }
    } while (((block->field_0x18 & 4) != 0) && (pBVar3->loop == block->loop));
    pIVar4 = pBVar3->firstInstr;
    IVar17 = pIVar4->m_kind;
    if ((IVar17 != InstrKindLabel) && (IVar17 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar7) goto LAB_003e4967;
      *puVar10 = 0;
    }
    if ((Region *)pIVar4[1].m_src2 == this->currentRegion) {
      __iter.current = (NodeBase *)&pBVar3->succList;
      local_58 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)__iter.current;
      do {
        if (local_58 == (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_003e4967;
          *puVar10 = 0;
        }
        local_58 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                   (local_58->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
        if (local_58 == (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)__iter.current) {
          if (local_48 != (Instr *)0x0) break;
          pBVar5 = pBVar3->next;
          ppFVar15 = (Func **)&pBVar5->firstInstr;
          if (pBVar5 == (BasicBlock *)0x0) {
            ppFVar15 = &pBVar3->func;
          }
          lVar13 = 0x18;
          if (pBVar5 == (BasicBlock *)0x0) {
            lVar13 = 0xd0;
          }
          pIVar4 = *(Instr **)((long)&(*ppFVar15)->m_alloc + lVar13);
          instr_00 = IR::Instr::Copy(instr,true);
          IVar17 = pIVar4->m_kind;
          if ((((IVar17 == InstrKindBranch) || (IVar17 == InstrKindExit)) ||
              (OVar1 = pIVar4->m_opcode, OVar1 - 0x23 < 3)) || (OVar1 - 0x173 < 2)) {
            if (pIVar4->m_prev->m_opcode != BailOnNoProfile) {
              if ((IVar17 == InstrKindBranch) && (((ulong)pIVar4[1]._vptr_Instr & 2) == 0)) {
                instr_00->m_func = pIVar4->m_func;
                IR::Instr::InsertBefore(pIVar4,instr_00);
              }
              break;
            }
          }
          else if (OVar1 != BailOnNoProfile) {
            instr_00->m_func = pIVar4->m_func;
            IR::Instr::InsertAfter(pIVar4,instr_00);
            break;
          }
          IR::Instr::Free(instr_00);
          break;
        }
        ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__iter.current);
        pBVar5 = (*ppFVar12)->succBlock;
        if (pBVar5 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2105,"(predSucc)","predSucc");
          if (!bVar7) goto LAB_003e4967;
          *puVar10 = 0;
        }
      } while ((pBVar5 == block) || ((pBVar5->field_0x18 & 0x80) != 0));
      goto LAB_003e45ed;
    }
LAB_003e48c4:
    if (block->number == 0) {
      IR::Instr::Free(instr);
      return true;
    }
    *(byte *)&local_40[1].m_func = *(byte *)&local_40[1].m_func | 0x22;
    instr->m_func = pIVar11->m_func;
    if (local_48 == (Instr *)0x0) {
      IR::Instr::InsertAfter(pIVar11,instr);
      uVar9 = (ushort)*(undefined4 *)&block->field_0x18 | 0x80;
    }
    else {
      IR::Instr::InsertAfter(local_48,instr);
      uVar9 = *(ushort *)&block->field_0x18 & 0xff7f;
    }
    *(ushort *)&block->field_0x18 = uVar9;
    if (this->tag != BackwardPhase) {
      return false;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(this);
    if (!bVar7) {
      return false;
    }
    this_01 = block->tempObjectTracker;
  }
  ObjectTemp::ProcessBailOnNoProfile(&this_01->super_ObjectTemp,instr);
  return false;
}

Assistant:

bool
BackwardPass::ProcessBailOnNoProfile(IR::Instr *instr, BasicBlock *block)
{
    Assert(this->tag == Js::BackwardPhase);
    Assert(instr->m_opcode == Js::OpCode::BailOnNoProfile);
    Assert(!instr->HasBailOutInfo());
    AnalysisAssert(block);

    if (this->IsPrePass())
    {
        return false;
    }
    if (this->currentRegion && (this->currentRegion->GetType() == RegionTypeCatch || this->currentRegion->GetType() == RegionTypeFinally))
    {
        return false;
    }

    IR::Instr *curInstr = instr->m_prev;

    if (curInstr->IsLabelInstr() && curInstr->AsLabelInstr()->isOpHelper)
    {
        // Already processed

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }

    // For generator functions, we don't want to move the BailOutOnNoProfile
    // above certain instructions such as GeneratorResumeYield or
    // CreateInterpreterStackFrameForGenerator. This indicates the insertion
    // point for the BailOutOnNoProfile in such cases.
    IR::Instr *insertionPointForGenerator = nullptr;

    // Don't hoist if we see calls with profile data (recursive calls)
    while(!curInstr->StartsBasicBlock())
    {
        if (curInstr->DontHoistBailOnNoProfileAboveInGeneratorFunction())
        {
            Assert(insertionPointForGenerator == nullptr);
            insertionPointForGenerator = curInstr;
        }

        // If a function was inlined, it must have had profile info.
        if (curInstr->m_opcode == Js::OpCode::InlineeEnd || curInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || curInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd
            || curInstr->m_opcode == Js::OpCode::InlineeStart || curInstr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)
        {
            break;
        }
        else if (OpCodeAttr::CallInstr(curInstr->m_opcode))
        {
            if (curInstr->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
            {
                break;
            }
        }
        curInstr = curInstr->m_prev;
    }

    // Didn't get to the top of the block, delete this BailOnNoProfile.
    if (!curInstr->IsLabelInstr())
    {
        block->RemoveInstr(instr);
        return true;
    }

    // Save the head instruction for later use.
    IR::LabelInstr *blockHeadInstr = curInstr->AsLabelInstr();

    // We can't bail in the middle of a "tmp = CmEq s1, s2; BrTrue tmp" turned into a "BrEq s1, s2",
    // because the bailout wouldn't be able to restore tmp.
    IR::Instr *curNext = curInstr->GetNextRealInstrOrLabel();
    IR::Instr *instrNope = nullptr;
    if (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
    {
        block->RemoveInstr(instr);
        return true;
        /*while (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
        {
            // Instead of just giving up, we can be a little trickier. We can instead treat the tmp declaration(s) as a
            // part of the block prefix, and put the bailonnoprofile immediately after them. This has the added benefit
            // that we can still merge up blocks beginning with bailonnoprofile, even if they would otherwise not allow
            // us to, due to the fact that these tmp declarations would be pre-empted by the higher-level bailout.
            instrNope = curNext;
            curNext = curNext->GetNextRealInstrOrLabel();
        }*/
    }

    curInstr = instr->m_prev;

    // Move to top of block (but just below any fgpeeptemp lds).
    while(!curInstr->StartsBasicBlock() && curInstr != instrNope)
    {
        // Delete redundant BailOnNoProfile
        if (curInstr->m_opcode == Js::OpCode::BailOnNoProfile)
        {
            Assert(!curInstr->HasBailOutInfo());
            curInstr = curInstr->m_next;
            curInstr->m_prev->Remove();
        }
        curInstr = curInstr->m_prev;
    }

    if (instr == block->GetLastInstr())
    {
        block->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();

    // Now try to move this up the flowgraph to the predecessor blocks
    FOREACH_PREDECESSOR_BLOCK(pred, block)
    {
        // Don't hoist BailOnNoProfile up past blocks containing GeneratorResumeYield
        bool hoistBailToPred = (insertionPointForGenerator == nullptr);

        if (block->isLoopHeader && pred->loop == block->loop)
        {
            // Skip loop back-edges
            continue;
        }

        if (pred->GetFirstInstr()->AsLabelInstr()->GetRegion() != this->currentRegion)
        {
            break;
        }

        // If all successors of this predecessor start with a BailOnNoProfile, we should be
        // okay to hoist this bail to the predecessor.
        FOREACH_SUCCESSOR_BLOCK(predSucc, pred)
        {
            if (predSucc == block)
            {
                continue;
            }
            if (!predSucc->beginsBailOnNoProfile)
            {
                hoistBailToPred = false;
                break;
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (hoistBailToPred)
        {
            IR::Instr *predInstr = pred->GetLastInstr();
            IR::Instr *instrCopy = instr->Copy();


            if (predInstr->EndsBasicBlock())
            {
                if (predInstr->m_prev->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else if (predInstr->IsBranchInstr() && !predInstr->AsBranchInstr()->m_isSwitchBr)
                {
                    // Don't put a bailout in the middle of a switch dispatch sequence.
                    // The bytecode offsets are not in order, and it would lead to incorrect
                    // bailout info.
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertBefore(instrCopy);
                }
            }
            else
            {
                if (predInstr->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else
                {
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertAfter(instrCopy);
                    pred->SetLastInstr(instrCopy);
                }
            }
        }
    } NEXT_PREDECESSOR_BLOCK;

    // If we have a BailOnNoProfile in the first block, there must have been at least one path out of this block that always throws.
    // Don't bother keeping the bailout in the first block as there are some issues in restoring the ArgIn bytecode registers on bailout
    // and throw case should be rare enough that it won't matter for perf.
    if (block->GetBlockNum() != 0)
    {
        blockHeadInstr->isOpHelper = true;
#if DBG
        blockHeadInstr->m_noHelperAssert = true;
#endif

        instr->m_func = curInstr->m_func;

        if (insertionPointForGenerator != nullptr)
        {
            insertionPointForGenerator->InsertAfter(instr);
            block->beginsBailOnNoProfile = false;
        }
        else
        {
            curInstr->InsertAfter(instr);
            block->beginsBailOnNoProfile = true;
        }

        bool setLastInstr = (curInstr == block->GetLastInstr());
        if (setLastInstr)
        {
            block->SetLastInstr(instr);
        }

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }
    else
    {
        instr->Free();
        return true;
    }
}